

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_server.c
# Opt level: O2

cio_error cio_http_server_register_location(cio_http_server *server,cio_http_location *location)

{
  if (location == (cio_http_location *)0x0 || server == (cio_http_server *)0x0) {
    return CIO_INVALID_ARGUMENT;
  }
  location->next = server->first_location;
  server->first_location = location;
  server->num_handlers = server->num_handlers + 1;
  return CIO_SUCCESS;
}

Assistant:

enum cio_error cio_http_server_register_location(struct cio_http_server *server, struct cio_http_location *location)
{
	if (cio_unlikely(server == NULL) || (location == NULL)) {
		return CIO_INVALID_ARGUMENT;
	}

	location->next = server->first_location;
	server->first_location = location;
	server->num_handlers++;
	return CIO_SUCCESS;
}